

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

void nn_surveyor_init(nn_surveyor *self,nn_sockbase_vfptr *vfptr,void *hint)

{
  nn_timer *self_00;
  nn_fsm_fn in_RDX;
  nn_fsm *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  nn_xsurveyor *in_stack_ffffffffffffffe0;
  
  nn_xsurveyor_init(in_stack_ffffffffffffffe0,
                    (nn_sockbase_vfptr *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(void *)0x141c97);
  self_00 = (nn_timer *)(in_RDI + 0x1b0);
  nn_sockbase_getctx((nn_sockbase *)0x141cb1);
  nn_fsm_init_root(in_RSI,in_RDX,(nn_fsm_fn)self_00,
                   (nn_ctx *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x208) = 1;
  nn_random_generate(in_RSI,(size_t)in_RDX);
  nn_timer_init(self_00,in_stack_ffffffffffffffdc,(nn_fsm *)0x141d13);
  nn_msg_init((nn_msg *)self_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x358) = 1000;
  *(undefined4 *)(in_RDI + 0x35c) = 0;
  nn_fsm_start((nn_fsm *)0x141d57);
  return;
}

Assistant:

static void nn_surveyor_init (struct nn_surveyor *self,
    const struct nn_sockbase_vfptr *vfptr, void *hint)
{
    nn_xsurveyor_init (&self->xsurveyor, vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_surveyor_handler, nn_surveyor_shutdown,
        nn_sockbase_getctx (&self->xsurveyor.sockbase));
    self->state = NN_SURVEYOR_STATE_IDLE;

    /*  Start assigning survey IDs beginning with a random number. This way
        there should be no key clashes even if the executable is re-started. */
    nn_random_generate (&self->surveyid, sizeof (self->surveyid));

    nn_timer_init (&self->timer, NN_SURVEYOR_SRC_DEADLINE_TIMER, &self->fsm);
    nn_msg_init (&self->tosend, 0);
    self->deadline = NN_SURVEYOR_DEFAULT_DEADLINE;
    self->timedout = 0;

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}